

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biattentional.cc
# Opt level: O2

void __thiscall
BidirAttentionalModel<dynet::LSTMBuilder>::initialise
          (BidirAttentionalModel<dynet::LSTMBuilder> *this,string *src_file,string *tgt_file,
          Model *model)

{
  long lVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  ParameterStorage **p;
  const_iterator __begin2;
  char *__assertion;
  ulong uVar7;
  uint uVar8;
  Model tm;
  long *local_d38;
  long *local_d30;
  long *local_d20;
  long *local_d18;
  Model sm;
  long *local_cb0;
  long *local_ca8;
  long *local_c98;
  long *local_c90;
  text_iarchive ia;
  ifstream in;
  AttentionalModel<dynet::LSTMBuilder> tmb;
  AttentionalModel<dynet::LSTMBuilder> smb;
  
  dynet::Model::Model(&sm);
  dynet::Model::Model(&tm);
  dynet::AttentionalModel<dynet::LSTMBuilder>::AttentionalModel
            (&smb,&sm,VOCAB_SIZE_SRC,VOCAB_SIZE_TGT,LAYERS,HIDDEN_DIM,ALIGN_DIM,BIDIR,GIZA_P,GIZA_M,
             GIZA_F,DOC,FERT);
  dynet::AttentionalModel<dynet::LSTMBuilder>::AttentionalModel
            (&tmb,&tm,VOCAB_SIZE_TGT,VOCAB_SIZE_SRC,LAYERS,HIDDEN_DIM,ALIGN_DIM,BIDIR,GIZA_P,GIZA_M,
             GIZA_F,DOC,FERT);
  poVar5 = std::operator<<((ostream *)&std::cerr,"... loading ");
  poVar5 = std::operator<<(poVar5,(string *)src_file);
  poVar5 = std::operator<<(poVar5," ...");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::ifstream::ifstream(&in,(string *)src_file,_S_in);
  boost::archive::text_iarchive::text_iarchive(&ia,(istream *)&in,0);
  boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
  invoke<dynet::Model>(&ia,&sm);
  boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
            (&ia.super_text_iarchive_impl<boost::archive::text_iarchive>);
  std::ifstream::~ifstream(&in);
  poVar5 = std::operator<<((ostream *)&std::cerr,"... loading ");
  poVar5 = std::operator<<(poVar5,(string *)tgt_file);
  poVar5 = std::operator<<(poVar5," ...");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::ifstream::ifstream(&in,(string *)tgt_file,_S_in);
  boost::archive::text_iarchive::text_iarchive(&ia,(istream *)&in,0);
  boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
  invoke<dynet::Model>(&ia,&tm);
  boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
            (&ia.super_text_iarchive_impl<boost::archive::text_iarchive>);
  std::ifstream::~ifstream(&in);
  poVar5 = std::operator<<((ostream *)&std::cerr,"... merging parameters ...");
  std::endl<char,std::char_traits<char>>(poVar5);
  if (*(long *)(model + 0x40) - *(long *)(model + 0x38) >> 3 ==
      (long)local_c90 - (long)local_c98 >> 2) {
    uVar7 = 0;
    for (; local_c98 != local_c90; local_c98 = local_c98 + 1) {
      uVar8 = 0;
      while( true ) {
        lVar1 = *(long *)(*local_c98 + 0x108);
        if ((ulong)((*(long *)(*local_c98 + 0x110) - lVar1) / 0x58) <= (ulong)uVar8) break;
        lVar6 = (ulong)uVar8 * 0x58;
        pvVar2 = *(void **)(lVar1 + 0x28 + lVar6);
        pvVar3 = *(void **)(*(long *)(*(long *)(*(long *)(model + 0x38) + uVar7 * 8) + 0x108) + 0x28
                           + lVar6);
        uVar4 = dynet::Dim::size((Dim *)(lVar1 + lVar6));
        memcpy(pvVar3,pvVar2,(ulong)uVar4 << 2);
        uVar8 = uVar8 + 1;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    }
    for (; local_d20 != local_d18; local_d20 = local_d20 + 1) {
      uVar8 = 0;
      while( true ) {
        lVar1 = *(long *)(*local_d20 + 0x108);
        if ((ulong)((*(long *)(*local_d20 + 0x110) - lVar1) / 0x58) <= (ulong)uVar8) break;
        lVar6 = (ulong)uVar8 * 0x58;
        pvVar2 = *(void **)(lVar1 + 0x28 + lVar6);
        pvVar3 = *(void **)(*(long *)(*(long *)(*(long *)(model + 0x38) + uVar7 * 8) + 0x108) + 0x28
                           + lVar6);
        uVar4 = dynet::Dim::size((Dim *)(lVar1 + lVar6));
        memcpy(pvVar3,pvVar2,(ulong)uVar4 << 2);
        uVar8 = uVar8 + 1;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    }
    if (*(long *)(model + 0x40) - *(long *)(model + 0x38) >> 3 == uVar7) {
      uVar7 = 0;
      for (; local_cb0 != local_ca8; local_cb0 = local_cb0 + 1) {
        pvVar2 = *(void **)(*local_cb0 + 0x58);
        pvVar3 = *(void **)(*(long *)(*(long *)(model + 0x20) + uVar7 * 8) + 0x58);
        uVar8 = dynet::Dim::size((Dim *)(*local_cb0 + 0x30));
        uVar7 = (ulong)((int)uVar7 + 1);
        memcpy(pvVar3,pvVar2,(ulong)uVar8 << 2);
      }
      for (; local_d38 != local_d30; local_d38 = local_d38 + 1) {
        pvVar2 = *(void **)(*local_d38 + 0x58);
        pvVar3 = *(void **)(*(long *)(*(long *)(model + 0x20) + uVar7 * 8) + 0x58);
        uVar8 = dynet::Dim::size((Dim *)(*local_d38 + 0x30));
        uVar7 = (ulong)((int)uVar7 + 1);
        memcpy(pvVar3,pvVar2,(ulong)uVar8 << 2);
      }
      if (*(long *)(model + 0x28) - *(long *)(model + 0x20) >> 3 == uVar7) {
        dynet::AttentionalModel<dynet::LSTMBuilder>::~AttentionalModel(&tmb);
        dynet::AttentionalModel<dynet::LSTMBuilder>::~AttentionalModel(&smb);
        dynet::Model::~Model(&tm);
        dynet::Model::~Model(&sm);
        return;
      }
      __assertion = "did == dparams.size()";
      uVar8 = 0x7e;
    }
    else {
      __assertion = "lid == lparams.size()";
      uVar8 = 0x76;
    }
  }
  else {
    __assertion = "lparams.size() == 2*sm.lookup_parameters_list().size()";
    uVar8 = 0x6b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/biattentional.cc"
                ,uVar8,
                "void BidirAttentionalModel<dynet::LSTMBuilder>::initialise(const std::string &, const std::string &, Model &) [Builder = dynet::LSTMBuilder]"
               );
}

Assistant:

void initialise(const std::string &src_file, const std::string &tgt_file, Model &model)
    {
	Model sm, tm;
	AttentionalModel<Builder> smb(&sm, VOCAB_SIZE_SRC, VOCAB_SIZE_TGT, 
		LAYERS, HIDDEN_DIM, ALIGN_DIM, BIDIR, GIZA_P, GIZA_M, GIZA_F, DOC, FERT);
	AttentionalModel<Builder> tmb(&tm, VOCAB_SIZE_TGT, VOCAB_SIZE_SRC,
		LAYERS, HIDDEN_DIM, ALIGN_DIM, BIDIR, GIZA_P, GIZA_M, GIZA_F, DOC, FERT);

	//for (const auto &p : sm.lookup_parameters_list())  
            //std::cerr << "\tlookup size: " << p->values[0].d << " number: " << p->values.size() << std::endl;
	//for (const auto &p : sm.parameters_list())  
            //std::cerr << "\tparam size: " << p->values.d << std::endl;

        std::cerr << "... loading " << src_file << " ..." << std::endl;
	{
	    ifstream in(src_file);
	    boost::archive::text_iarchive ia(in);
	    ia >> sm;
	}

        std::cerr << "... loading " << tgt_file << " ..." << std::endl;
	{
	    ifstream in(tgt_file);
	    boost::archive::text_iarchive ia(in);
	    ia >> tm;
	}
        std::cerr << "... merging parameters ..." << std::endl;

	unsigned lid = 0;
	auto &lparams = model.lookup_parameters_list();
	assert(lparams.size() == 2*sm.lookup_parameters_list().size());
	for (const auto &p : sm.lookup_parameters_list())  {
	    for (unsigned i = 0; i < p->values.size(); ++i) 
		memcpy(lparams[lid]->values[i].v, &p->values[i].v[0], sizeof(dynet::real) * p->values[i].d.size());
	    lid++;
	}
	for (const auto &p : tm.lookup_parameters_list()) {
	    for (unsigned i = 0; i < p->values.size(); ++i) 
		memcpy(lparams[lid]->values[i].v, &p->values[i].v[0], sizeof(dynet::real) * p->values[i].d.size());
	    lid++;
	}
	assert(lid == lparams.size());

	unsigned did = 0;
	auto &dparams = model.parameters_list();
	for (const auto &p : sm.parameters_list()) 
	    memcpy(dparams[did++]->values.v, &p->values.v[0], sizeof(dynet::real) * p->values.d.size());
	for (const auto &p : tm.parameters_list()) 
	    memcpy(dparams[did++]->values.v, &p->values.v[0], sizeof(dynet::real) * p->values.d.size());
	assert(did == dparams.size());
    }